

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::handle_accept(TcpServer *this,pointer *acc,pointer *new_connection)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  int in_ECX;
  int __type;
  int __type_00;
  TcpAcceptor *in_RDX;
  int iVar5;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffeb8;
  unique_lock<std::mutex> *in_stack_fffffffffffffec0;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *in_stack_fffffffffffffec8;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *in_stack_fffffffffffffed0;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *in_stack_fffffffffffffed8;
  TcpConnection *in_stack_fffffffffffffee0;
  SocketFactory *sf;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar6;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  local_a8;
  SocketFactory local_88 [2];
  undefined1 local_48 [40];
  io_context *in_stack_ffffffffffffffe0;
  
  peVar2 = std::
           __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x7068b8);
  TcpConnection::socket((TcpConnection *)(local_48 + 0x20),(int)peVar2,__type,in_ECX);
  peVar3 = std::
           __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x7068d7);
  (*peVar3->_vptr_Socket[0xe])(peVar3,1,0);
  std::shared_ptr<gmlc::networking::Socket>::~shared_ptr
            ((shared_ptr<gmlc::networking::Socket> *)0x7068f9);
  peVar2 = std::
           __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x706903);
  TcpConnection::socket((TcpConnection *)local_48,(int)peVar2,__type_00,in_ECX);
  peVar3 = std::
           __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x706922);
  (*peVar3->_vptr_Socket[0xc])(peVar3,1);
  std::shared_ptr<gmlc::networking::Socket>::~shared_ptr
            ((shared_ptr<gmlc::networking::Socket> *)0x706942);
  iVar5 = 5;
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_fffffffffffffec8,
                     (memory_order)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x706968);
    TcpConnection::close(peVar2,iVar5);
  }
  else {
    std::
    __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x7069cb);
    TcpConnection::setHandshakeModeServer((TcpConnection *)0x7069d3);
    std::
    __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x7069dd);
    TcpConnection::handshake((TcpConnection *)0x7069e5);
    std::
    __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x7069ef);
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::function(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    TcpConnection::setDataCall(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)0x706a30);
    peVar2 = std::
             __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x706a3a);
    sf = local_88;
    std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
    ::function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                *)in_stack_fffffffffffffed0,
               (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                *)in_stack_fffffffffffffec8);
    TcpConnection::setErrorCall
              (peVar2,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                       *)in_stack_fffffffffffffed8);
    std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
    ::~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                 *)0x706a7b);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)0x706a8c);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x706a9f);
      in_stack_fffffffffffffed8 = &local_a8;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)peVar4,
                 (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_fffffffffffffec8);
      TcpConnection::setLoggingFunction
                (peVar2,(function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)in_stack_fffffffffffffed8);
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)0x706ae0);
    }
    std::
    __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x706b5e);
    TcpConnection::startReceive
              ((TcpConnection *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    std::unique_lock<std::mutex>::unique_lock(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    iVar5 = 5;
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffffec8,
                       (memory_order)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock(in_stack_fffffffffffffec0);
      peVar4 = std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x706bef);
      TcpConnection::close(peVar4,iVar5);
    }
    else {
      std::
      vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
      ::push_back((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                   *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
    }
    uVar6 = (uint)bVar1;
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffec0);
    if (uVar6 == 0) {
      std::
      __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x706c37);
      TcpConnection::create(sf,(io_context *)peVar2,(size_t)in_stack_fffffffffffffed8);
      TcpAcceptor::start(in_RDX,(pointer *)in_stack_ffffffffffffffe0);
      std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpConnection> *)0x706c80);
    }
  }
  return;
}

Assistant:

void TcpServer::handle_accept(
    TcpAcceptor::pointer acc,
    TcpConnection::pointer new_connection)
{
    /*setting linger to 1 second*/
    new_connection->socket()->set_option_linger(true, 0);
    new_connection->socket()->set_option_no_delay(true);
    // Set options here
    if (halted.load()) {
        new_connection->close();
        return;
    }

    new_connection->setHandshakeModeServer();
    new_connection->handshake();

    new_connection->setDataCall(dataCall);
    new_connection->setErrorCall(errorCall);
    if (logFunction) {
        new_connection->setLoggingFunction(logFunction);
    }
    new_connection->startReceive();
    {  // scope for the lock_guard

        std::unique_lock<std::mutex> lock(accepting);
        if (!halted.load()) {
            connections.push_back(std::move(new_connection));
        } else {
            lock.unlock();
            new_connection->close();
            return;
        }
    }
    acc->start(TcpConnection::create(socket_factory, ioctx, bufferSize));
}